

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomSizeF::read(DomSizeF *this,int __fd,void *__buf,size_t __nbytes)

{
  double dVar1;
  int iVar2;
  undefined4 in_register_00000034;
  QString *pQVar3;
  long in_FS_OFFSET;
  QStringView QVar4;
  QStringView QVar5;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_78;
  QString local_60;
  QStringView local_48;
  long local_38;
  
  pQVar3 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QXmlStreamReader::error();
  if (iVar2 == 0) {
    do {
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 == 4) {
        local_48.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_48.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = (QStringView)QXmlStreamReader::name();
        QVar4.m_data = L"width";
        QVar4.m_size = 5;
        iVar2 = QtPrivate::compareStrings(local_48,QVar4,CaseInsensitive);
        if (iVar2 == 0) {
          QXmlStreamReader::readElementText(&local_60,pQVar3,0);
          dVar1 = (double)QString::toDouble((bool *)&local_60);
          *(byte *)&this->m_children = (byte)this->m_children | 1;
          this->m_width = dVar1;
        }
        else {
          QVar5.m_data = L"height";
          QVar5.m_size = 6;
          iVar2 = QtPrivate::compareStrings(local_48,QVar5,CaseInsensitive);
          if (iVar2 == 0) {
            QXmlStreamReader::readElementText(&local_60,pQVar3,0);
            dVar1 = (double)QString::toDouble((bool *)&local_60);
            *(byte *)&this->m_children = (byte)this->m_children | 2;
            this->m_height = dVar1;
          }
          else {
            local_78.a.m_size = 0x13;
            local_78.a.m_data = "Unexpected element ";
            local_78.b = &local_48;
            QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                      (&local_60,&local_78);
            QXmlStreamReader::raiseError(pQVar3);
          }
        }
        if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else if (iVar2 == 5) break;
      iVar2 = QXmlStreamReader::error();
    } while (iVar2 == 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomSizeF::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"width"_s, Qt::CaseInsensitive)) {
                setElementWidth(reader.readElementText().toDouble());
                continue;
            }
            if (!tag.compare(u"height"_s, Qt::CaseInsensitive)) {
                setElementHeight(reader.readElementText().toDouble());
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}